

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_list::apply_ip_filter
          (peer_list *this,ip_filter *filter,torrent_state *state,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *banned)

{
  _Map_pointer ppptVar1;
  peer_connection_interface *ppVar2;
  _Map_pointer ppptVar3;
  _Elt_pointer pptVar4;
  _Elt_pointer pptVar5;
  _Map_pointer ppptVar6;
  _Elt_pointer pptVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  _Map_pointer ppptVar11;
  _Elt_pointer pptVar12;
  int __type;
  ulong uVar13;
  _Elt_pointer pptVar14;
  ulong uVar15;
  long lVar16;
  _Elt_pointer pptVar17;
  _Map_pointer ppptVar18;
  _Elt_pointer local_b0;
  error_code local_a8;
  undefined8 uStack_98;
  ulong local_90;
  long local_88;
  peer_list *local_80;
  ip_filter *local_78;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *local_70;
  torrent_state *local_68;
  peer_connection_interface *local_60;
  _Elt_pointer local_58;
  iterator local_50;
  short *psVar10;
  
  pptVar14 = (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pptVar14 !=
      (this->m_peers).
      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      .
      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_b0 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
    pptVar12 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppptVar18 = (this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_80 = this;
    local_78 = filter;
    local_70 = banned;
    local_68 = state;
    do {
      torrent_peer::address(*pptVar14);
      uVar8 = ip_filter::access(filter,(char *)&local_a8,__type);
      if (((uVar8 & 1) == 0) || (*pptVar14 == this->m_locked_peer)) {
        pptVar14 = pptVar14 + 1;
        ppptVar11 = ppptVar18;
        if (pptVar14 == pptVar12) {
          pptVar14 = ppptVar18[1];
          pptVar12 = pptVar14 + 0x40;
          ppptVar11 = ppptVar18 + 1;
          local_b0 = pptVar14;
        }
      }
      else {
        ppptVar1 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        lVar16 = (long)(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)(this->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3;
        local_88 = ((long)pptVar14 - (long)local_b0 >> 3) + lVar16 +
                   ((((ulong)((long)ppptVar18 - (long)ppptVar1) >> 3) - 1) +
                   (ulong)(ppptVar18 == (_Map_pointer)0x0)) * 0x40;
        ppVar2 = (*pptVar14)->connection;
        pptVar17 = pptVar12;
        if (ppVar2 != (peer_connection_interface *)0x0) {
          ppptVar3 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          pptVar4 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pptVar5 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first;
          local_60 = ppVar2;
          local_58 = pptVar12;
          iVar9 = (*ppVar2->_vptr_peer_connection_interface[2])();
          psVar10 = (short *)CONCAT44(extraout_var,iVar9);
          if (*psVar10 == 2) {
            local_a8 = (error_code)(ZEXT416(*(uint *)(psVar10 + 2)) << 0x20);
            uStack_98 = 0;
            local_90 = 0;
          }
          else {
            uStack_98 = *(undefined8 *)(psVar10 + 8);
            local_90 = (ulong)*(uint *)(psVar10 + 0xc);
            local_a8.cat_ = *(error_category **)(psVar10 + 4);
            local_a8.val_ = 1;
            local_a8.failed_ = false;
            local_a8._5_3_ = 0;
          }
          ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
          emplace_back<boost::asio::ip::address>(local_70,(address *)&local_a8);
          local_a8 = errors::make_error_code(banned_by_ip_filter);
          (*local_60->_vptr_peer_connection_interface[4])(local_60,(address *)&local_a8,1,0);
          ppptVar6 = (local_80->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppptVar11 = (local_80->m_peers).
                      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      .
                      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node;
          pptVar7 = (local_80->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar12 = (local_80->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last;
          filter = local_78;
          pptVar17 = local_58;
          this = local_80;
          if (((long)pptVar12 - (long)pptVar7 >> 3) +
              ((long)(local_80->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(local_80->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)ppptVar6 - (long)ppptVar11) >> 3) - 1) +
              (ulong)(ppptVar6 == (_Map_pointer)0x0)) * 0x40 <
              ((long)pptVar4 - (long)pptVar5 >> 3) + lVar16 +
              ((((ulong)((long)ppptVar3 - (long)ppptVar1) >> 3) - 1) +
              (ulong)(ppptVar3 == (_Map_pointer)0x0)) * 0x40) {
            local_b0 = (local_80->m_peers).
                       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       .
                       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first;
            uVar15 = ((long)pptVar7 - (long)local_b0 >> 3) + (long)(int)local_88;
            if (uVar15 < 0x40) {
              pptVar14 = pptVar7 + (int)local_88;
            }
            else {
              uVar13 = uVar15 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar15) {
                uVar13 = uVar15 >> 6;
              }
              ppptVar11 = ppptVar11 + uVar13;
              local_b0 = *ppptVar11;
              pptVar12 = local_b0 + 0x40;
              pptVar14 = local_b0 + uVar15 + uVar13 * -0x40;
            }
            goto LAB_00288f4e;
          }
        }
        local_50._M_first = local_b0;
        local_50._M_cur = pptVar14;
        local_50._M_last = pptVar17;
        local_50._M_node = ppptVar18;
        erase_peer(this,&local_50,local_68);
        pptVar14 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b0 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first;
        ppptVar11 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
        uVar15 = ((long)pptVar14 - (long)local_b0 >> 3) + (long)(int)local_88;
        if (uVar15 < 0x40) {
          pptVar12 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last;
          pptVar14 = pptVar14 + (int)local_88;
        }
        else {
          uVar13 = uVar15 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar15) {
            uVar13 = uVar15 >> 6;
          }
          ppptVar11 = ppptVar11 + uVar13;
          local_b0 = *ppptVar11;
          pptVar12 = local_b0 + 0x40;
          pptVar14 = local_b0 + uVar15 + uVar13 * -0x40;
        }
      }
LAB_00288f4e:
      ppptVar18 = ppptVar11;
    } while (pptVar14 !=
             (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return;
}

Assistant:

void peer_list::apply_ip_filter(ip_filter const& filter
		, torrent_state* state, std::vector<address>& banned)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		for (auto i = m_peers.begin(); i != m_peers.end();)
		{
			if ((filter.access((*i)->address()) & ip_filter::blocked) == 0)
			{
				++i;
				continue;
			}
			if (*i == m_locked_peer)
			{
				++i;
				continue;
			}

			int const current = int(i - m_peers.begin());
			TORRENT_ASSERT(current >= 0);
			TORRENT_ASSERT(m_peers.size() > 0);
			TORRENT_ASSERT(i != m_peers.end());

			if ((*i)->connection)
			{
				// disconnecting the peer here may also delete the
				// peer_info_struct. If that is the case, just continue
				size_t count = m_peers.size();
				peer_connection_interface* p = (*i)->connection;

				banned.push_back(p->remote().address());

				p->disconnect(errors::banned_by_ip_filter
					, operation_t::bittorrent);

				// what *i refers to has changed, i.e. cur was deleted
				if (m_peers.size() < count)
				{
					i = m_peers.begin() + current;
					continue;
				}
				TORRENT_ASSERT((*i)->connection == nullptr
					|| (*i)->connection->peer_info_struct() == nullptr);
			}

			erase_peer(i, state);
			i = m_peers.begin() + current;
		}
	}